

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 14_recursive_func.cpp
# Opt level: O2

void init_ruler(char *arr)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x3a; lVar1 = lVar1 + 1) {
    arr[lVar1] = ' ';
  }
  *arr = '|';
  arr[0x3a] = '|';
  arr[0x3b] = '\0';
  return;
}

Assistant:

void init_ruler (char arr[]) {
    //  初始化
    int i = 0;
    for(i = 0; i < LENGTH - 2; i++) {
        arr[i] = ' ';
    }
    arr[LENGTH - 1] = '\0';

    int max = LENGTH - 2;
    int min = 0;
    arr[max] = arr[min] = '|';
}